

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O3

void __thiscall ED::JoinAnchorPointsUsingSortedAnchors(ED *this)

{
  pointer *ppPVar1;
  Point PVar2;
  undefined8 uVar3;
  uchar *puVar4;
  short *psVar5;
  Point *pPVar6;
  pointer pvVar7;
  pointer pPVar8;
  int count;
  int iVar9;
  int iVar10;
  int *piVar11;
  void *__s;
  int *piVar12;
  Chain *chains;
  int *piVar13;
  int *piVar14;
  uchar *puVar15;
  undefined8 *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  pointer pvVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  size_t sVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar50;
  int iVar51;
  uint uVar52;
  int local_e0;
  long local_98;
  undefined1 local_68 [16];
  pointer local_58;
  int *local_48;
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  *local_40;
  long local_38;
  
  iVar9 = this->width;
  iVar37 = this->height;
  iVar10 = iVar37 + iVar9;
  uVar30 = (long)(iVar10 * 8) << 2;
  if (iVar10 < 0) {
    uVar30 = 0xffffffffffffffff;
  }
  piVar11 = (int *)operator_new__(uVar30);
  iVar37 = iVar37 * iVar9;
  lVar41 = (long)iVar37;
  sVar31 = lVar41 * 8;
  if (iVar37 < 0) {
    sVar31 = 0xffffffffffffffff;
  }
  __s = operator_new__(sVar31);
  if (iVar37 != 0) {
    memset(__s,0,lVar41 * 8);
  }
  uVar30 = lVar41 << 4;
  uVar39 = lVar41 << 5;
  if (iVar37 < 0) {
    uVar30 = 0xffffffffffffffff;
    uVar39 = 0xffffffffffffffff;
  }
  piVar12 = (int *)operator_new__(uVar30);
  chains = (Chain *)operator_new__(uVar39);
  local_48 = sortAnchorsByGradValue1(this);
  lVar41 = (long)this->anchorNos;
  if (lVar41 < 1) {
LAB_001087b9:
    pvVar7 = (this->segmentPoints).
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->segmentPoints).
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar7 + -1;
    pPVar8 = pvVar7[-1].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pPVar8 != (pointer)0x0) {
      operator_delete(pPVar8);
    }
    operator_delete__(local_48);
    operator_delete__(chains);
    operator_delete__(piVar12);
    operator_delete__(piVar11);
    operator_delete__(__s);
    return;
  }
  local_40 = (vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
              *)&this->segmentPoints;
LAB_0010770c:
  iVar10 = this->width;
  iVar9 = local_48[lVar41 + -1] / iVar10;
  iVar37 = local_48[lVar41 + -1] % iVar10;
  puVar15 = this->edgeImg;
  iVar27 = iVar9 * iVar10 + iVar37;
  local_38 = lVar41;
  if (puVar15[iVar27] == 0xfe) {
    chains->children[1] = -1;
    chains->dir = 0;
    chains->len = 0;
    chains->parent = -1;
    chains->children[0] = -1;
    chains->pixels = (Point *)0x0;
    bVar42 = this->dirImg[iVar27] == '\x01';
    *piVar12 = iVar9;
    piVar12[1] = iVar37;
    piVar12[3] = bVar42 + 2 + (uint)bVar42;
    uVar39 = 0;
    piVar12[2] = 0;
    piVar12[4] = iVar9;
    piVar12[5] = iVar37;
    piVar12[7] = bVar42 + 1 + (uint)bVar42;
    piVar12[6] = 0;
    lVar41 = 1;
    uVar30 = 1;
    iVar9 = 0;
    uVar29 = 1;
LAB_001077b3:
    do {
      piVar14 = piVar12 + uVar30 * 4;
      iVar37 = piVar12[uVar30 * 4];
      iVar27 = piVar12[uVar30 * 4 + 1];
      iVar17 = piVar12[uVar30 * 4 + 3];
      iVar51 = piVar12[uVar30 * 4 + 2];
      lVar32 = (long)(iVar10 * iVar37 + iVar27);
      iVar9 = (uint)(puVar15[lVar32] != 0xff) + iVar9;
      chains[lVar41].dir = iVar17;
      chains[lVar41].parent = iVar51;
      chains[lVar41].children[0] = -1;
      chains[lVar41].children[1] = -1;
      iVar38 = (int)uVar39;
      lVar22 = (long)iVar38;
      chains[lVar41].pixels = (Point *)((long)__s + lVar22 * 8);
      *(int *)((long)__s + lVar22 * 8 + 4) = iVar37;
      *(int *)((long)__s + lVar22 * 8) = iVar27;
      iVar20 = iVar38 + 1;
      puVar4 = this->dirImg;
      iVar34 = (int)uVar30;
      iVar21 = (int)lVar41;
      if (iVar17 == 1) {
        lVar22 = (long)(iVar10 * iVar37 + iVar27);
        iVar17 = 0;
        if (puVar4[lVar22] == '\x02') {
          piVar13 = (int *)((long)__s + (long)iVar20 * 8 + 4);
          iVar17 = iVar27 + -1;
          lVar36 = 0;
          do {
            puVar15[lVar22] = 0xff;
            puVar15 = this->edgeImg;
            iVar23 = iVar37 + -1;
            iVar10 = this->width;
            iVar28 = (int)lVar36;
            iVar38 = iVar10 * iVar23 + iVar27 + iVar28;
            if (puVar15[iVar38] == 0xfe) {
              puVar15[iVar38] = '\0';
              puVar15 = this->edgeImg;
              iVar10 = this->width;
            }
            iVar18 = iVar37 + 1;
            iVar38 = iVar10 * iVar18 + iVar27 + iVar28;
            if (puVar15[iVar38] == 0xfe) {
              puVar15[iVar38] = '\0';
              puVar15 = this->edgeImg;
              iVar10 = this->width;
            }
            iVar19 = iVar10 * iVar37 + iVar17 + iVar28;
            iVar38 = iVar37;
            if (((puVar15[iVar19] < 0xfe) &&
                (iVar33 = iVar10 * iVar23 + iVar17 + iVar28, iVar38 = iVar23, puVar15[iVar33] < 0xfe
                )) && (iVar35 = iVar10 * iVar18 + iVar17 + iVar28, iVar38 = iVar18,
                      puVar15[iVar35] < 0xfe)) {
              psVar5 = this->gradImg;
              if (psVar5[iVar19] < psVar5[iVar33]) {
                iVar38 = iVar23;
                if (psVar5[iVar33] <= psVar5[iVar35]) {
                  iVar38 = iVar18;
                }
              }
              else if (psVar5[iVar35] <= psVar5[iVar19]) {
                iVar38 = iVar37;
              }
            }
            iVar37 = iVar38;
            lVar22 = (long)(iVar37 * iVar10 + iVar17 + iVar28);
            if ((puVar15[lVar22] == 0xff) || ((int)this->gradImg[lVar22] < this->gradThresh))
            goto LAB_00107eaf;
            *piVar13 = iVar37;
            piVar13[-1] = iVar17 + iVar28;
            lVar36 = lVar36 + -1;
            piVar13 = piVar13 + 2;
          } while (this->dirImg[lVar22] == '\x02');
          iVar17 = (int)lVar36;
          iVar20 = iVar20 - iVar17;
          iVar27 = iVar27 + iVar17;
          iVar17 = -iVar17;
        }
        *piVar14 = iVar37;
        piVar14[1] = iVar27;
        piVar14[3] = 4;
        piVar14[2] = iVar21;
        piVar12[uVar30 * 4 + 4] = iVar37;
        piVar12[uVar30 * 4 + 5] = iVar27;
        piVar12[uVar30 * 4 + 7] = 3;
LAB_00107fe6:
        piVar12[uVar30 * 4 + 6] = iVar21;
        chains[lVar41].len = iVar17;
        chains[iVar51].children[0] = iVar21;
      }
      else {
        if (iVar17 == 2) {
          lVar22 = (long)(iVar10 * iVar37 + iVar27);
          lVar32 = 0;
          if (puVar4[lVar22] == '\x02') {
            lVar36 = (long)iVar20 * 8;
            lVar32 = 0;
            do {
              puVar15[lVar22] = 0xff;
              puVar15 = this->edgeImg;
              iVar38 = iVar37 + 1;
              iVar10 = this->width;
              iVar23 = (int)lVar32;
              iVar17 = iVar10 * iVar38 + iVar27 + iVar23;
              if (puVar15[iVar17] == 0xfe) {
                puVar15[iVar17] = '\0';
                puVar15 = this->edgeImg;
                iVar10 = this->width;
              }
              iVar28 = iVar37 + -1;
              iVar17 = iVar10 * iVar28 + iVar27 + iVar23;
              if (puVar15[iVar17] == 0xfe) {
                puVar15[iVar17] = '\0';
                puVar15 = this->edgeImg;
                iVar10 = this->width;
              }
              iVar18 = iVar10 * iVar37 + iVar27 + iVar23 + 1;
              iVar17 = iVar37;
              if (((puVar15[iVar18] < 0xfe) &&
                  (iVar19 = iVar10 * iVar38 + iVar27 + iVar23 + 1, iVar17 = iVar38,
                  puVar15[iVar19] < 0xfe)) &&
                 (iVar33 = iVar10 * iVar28 + iVar27 + iVar23 + 1, iVar17 = iVar28,
                 puVar15[iVar33] < 0xfe)) {
                psVar5 = this->gradImg;
                if (psVar5[iVar18] < psVar5[iVar33]) {
                  if (psVar5[iVar33] <= psVar5[iVar19]) {
                    iVar17 = iVar38;
                  }
                }
                else {
                  iVar17 = iVar38;
                  if (psVar5[iVar19] <= psVar5[iVar18]) {
                    iVar17 = iVar37;
                  }
                }
              }
              iVar37 = iVar17;
              lVar22 = (long)(iVar37 * iVar10 + iVar27 + iVar23 + 1);
              if ((puVar15[lVar22] == 0xff) || ((int)this->gradImg[lVar22] < this->gradThresh)) {
                chains[lVar41].len = iVar23 + 1;
                piVar14 = chains[iVar51].children + 1;
                uVar24 = iVar20 + lVar32;
                goto LAB_00107f70;
              }
              *(int *)((long)__s + lVar32 * 8 + lVar36 + 4) = iVar37;
              *(int *)((long)__s + lVar32 * 8 + lVar36) = iVar27 + iVar23 + 1;
              lVar32 = lVar32 + 1;
            } while (this->dirImg[lVar22] == '\x02');
            iVar20 = iVar20 + (int)lVar32;
            iVar27 = iVar27 + (int)lVar32;
          }
          *piVar14 = iVar37;
          piVar14[1] = iVar27;
          piVar14[3] = 4;
          piVar14[2] = iVar21;
          piVar12[uVar30 * 4 + 4] = iVar37;
          piVar12[uVar30 * 4 + 5] = iVar27;
          piVar12[uVar30 * 4 + 7] = 3;
          piVar12[uVar30 * 4 + 6] = iVar21;
          chains[lVar41].len = (int)lVar32;
        }
        else {
          if (iVar17 == 3) {
            iVar17 = 0;
            if (puVar4[lVar32] == '\x01') {
              piVar13 = (int *)((long)__s + (long)iVar20 * 8 + 4);
              lVar36 = 0;
              do {
                iVar17 = iVar37 + (int)lVar36;
                puVar15[lVar32] = 0xff;
                puVar15 = this->edgeImg;
                iVar10 = this->width;
                lVar22 = (long)(iVar17 * iVar10 + iVar27);
                if (puVar15[lVar22 + -1] == 0xfe) {
                  puVar15[lVar22 + -1] = '\0';
                  puVar15 = this->edgeImg;
                  iVar10 = this->width;
                  lVar22 = (long)(iVar17 * iVar10 + iVar27);
                }
                if (puVar15[lVar22 + 1] == 0xfe) {
                  puVar15[lVar22 + 1] = '\0';
                  puVar15 = this->edgeImg;
                  iVar10 = this->width;
                }
                iVar38 = iVar37 + -1 + (int)lVar36;
                iVar17 = iVar38 * iVar10;
                lVar22 = (long)(iVar17 + iVar27);
                if (puVar15[lVar22] < 0xfe) {
                  if (puVar15[lVar22 + -1] < 0xfe) {
                    if (puVar15[lVar22 + 1] < 0xfe) {
                      psVar5 = this->gradImg;
                      if (psVar5[lVar22] < psVar5[lVar22 + -1]) {
                        if (psVar5[lVar22 + 1] < psVar5[lVar22 + -1]) {
                          iVar27 = iVar27 + -1;
                        }
                        else {
                          iVar27 = iVar27 + 1;
                        }
                      }
                      else {
                        iVar27 = iVar27 + (uint)(psVar5[lVar22] < psVar5[lVar22 + 1]);
                      }
                    }
                    else {
                      iVar27 = iVar27 + 1;
                    }
                  }
                  else {
                    iVar27 = iVar27 + -1;
                  }
                }
                lVar32 = (long)(iVar17 + iVar27);
                if ((puVar15[lVar32] == 0xff) || ((int)this->gradImg[lVar32] < this->gradThresh))
                goto LAB_00107eaf;
                *piVar13 = iVar38;
                piVar13[-1] = iVar27;
                lVar36 = lVar36 + -1;
                piVar13 = piVar13 + 2;
              } while (this->dirImg[lVar32] == '\x01');
              iVar17 = (int)lVar36;
              iVar20 = iVar20 - iVar17;
              iVar37 = iVar37 + iVar17;
              iVar17 = -iVar17;
            }
            *piVar14 = iVar37;
            piVar14[1] = iVar27;
            piVar14[3] = 2;
            piVar14[2] = iVar21;
            piVar12[uVar30 * 4 + 4] = iVar37;
            piVar12[uVar30 * 4 + 5] = iVar27;
            piVar12[uVar30 * 4 + 7] = 1;
            goto LAB_00107fe6;
          }
          lVar22 = (long)(iVar10 * iVar37 + iVar27);
          iVar17 = 0;
          if (puVar4[lVar22] == '\x01') {
            uVar24 = (ulong)iVar20;
            iVar20 = 1;
            do {
              iVar17 = iVar20;
              puVar15[lVar22] = 0xff;
              puVar15 = this->edgeImg;
              iVar10 = this->width;
              lVar22 = (long)(iVar10 * iVar37 + iVar27);
              if (puVar15[lVar22 + 1] == 0xfe) {
                puVar15[lVar22 + 1] = '\0';
                puVar15 = this->edgeImg;
                iVar10 = this->width;
                lVar22 = (long)(iVar10 * iVar37 + iVar27);
              }
              if (puVar15[lVar22 + -1] == 0xfe) {
                puVar15[lVar22 + -1] = '\0';
                puVar15 = this->edgeImg;
                iVar10 = this->width;
              }
              iVar37 = iVar37 + 1;
              lVar22 = (long)(iVar10 * iVar37 + iVar27);
              if (puVar15[lVar22] < 0xfe) {
                if (puVar15[lVar22 + 1] < 0xfe) {
                  if (puVar15[lVar22 + -1] < 0xfe) {
                    psVar5 = this->gradImg;
                    if (psVar5[lVar22] < psVar5[lVar22 + -1]) {
                      if (psVar5[lVar22 + 1] < psVar5[lVar22 + -1]) {
                        iVar27 = iVar27 + -1;
                      }
                      else {
                        iVar27 = iVar27 + 1;
                      }
                    }
                    else {
                      iVar27 = iVar27 + (uint)(psVar5[lVar22] < psVar5[lVar22 + 1]);
                    }
                  }
                  else {
                    iVar27 = iVar27 + -1;
                  }
                }
                else {
                  iVar27 = iVar27 + 1;
                }
              }
              lVar22 = (long)(iVar10 * iVar37 + iVar27);
              if ((puVar15[lVar22] == 0xff) || ((int)this->gradImg[lVar22] < this->gradThresh)) {
                chains[lVar41].len = iVar17;
                piVar14 = chains[iVar51].children + 1;
                goto LAB_00107f70;
              }
              *(int *)((long)__s + uVar24 * 8 + 4) = iVar37;
              *(int *)((long)__s + uVar24 * 8) = iVar27;
              uVar24 = uVar24 + 1;
              iVar20 = iVar17 + 1;
            } while (this->dirImg[lVar22] == '\x01');
            iVar20 = iVar38 + iVar17 + 1;
          }
          *piVar14 = iVar37;
          piVar14[1] = iVar27;
          piVar14[3] = 2;
          piVar14[2] = iVar21;
          piVar12[uVar30 * 4 + 4] = iVar37;
          piVar12[uVar30 * 4 + 5] = iVar27;
          piVar12[uVar30 * 4 + 7] = 1;
          piVar12[uVar30 * 4 + 6] = iVar21;
          chains[lVar41].len = iVar17;
        }
        chains[iVar51].children[1] = iVar21;
      }
      uVar30 = (ulong)(iVar34 + 1U);
      uVar39 = (ulong)(iVar20 - 1U);
      lVar41 = lVar41 + 1;
      uVar29 = uVar29 + 1;
      uVar24 = (ulong)(iVar20 - 1U);
    } while (-1 < (int)(iVar34 + 1U));
    goto LAB_00108024;
  }
  goto LAB_001087a0;
LAB_00107eaf:
  local_98 = (long)iVar20;
  chains[lVar41].len = 1 - (int)lVar36;
  piVar14 = chains[iVar51].children;
  uVar24 = local_98 - lVar36;
LAB_00107f70:
  *piVar14 = iVar21;
  uVar29 = iVar21 + 1;
  lVar41 = (long)(int)uVar29;
  uVar39 = uVar24 & 0xffffffff;
  uVar30 = (ulong)(iVar34 - 1);
  if (iVar34 < 1) goto LAB_00108024;
  goto LAB_001077b3;
LAB_00108024:
  if ((int)uVar24 - iVar9 < this->minPathLen) {
    if (0 < (int)uVar24) {
      uVar30 = 0;
      do {
        this->edgeImg
        [(long)*(int *)((long)__s + uVar30 * 8) +
         (long)this->width * (long)*(int *)((long)__s + uVar30 * 8 + 4)] = '\0';
        this->edgeImg
        [(long)*(int *)((long)__s + uVar30 * 8) +
         (long)this->width * (long)*(int *)((long)__s + uVar30 * 8 + 4)] = '\0';
        uVar30 = uVar30 + 1;
      } while ((uVar24 & 0xffffffff) != uVar30);
    }
  }
  else {
    iVar10 = LongestChain(chains,chains->children[1]);
    uVar40 = 0;
    if ((0 < iVar10) && (iVar10 = chains->children[1], uVar40 = 0, iVar10 != -1)) {
      lVar22 = 0;
      do {
        piVar11[lVar22] = iVar10;
        iVar9 = chains[iVar10].children[0];
        if (chains[iVar10].children[0] == -1) {
          iVar9 = chains[iVar10].children[1];
        }
        iVar10 = iVar9;
        lVar22 = lVar22 + 1;
      } while (iVar10 != -1);
      if (0 < (int)(uint)lVar22) {
        uVar40 = 0;
        uVar30 = (ulong)((uint)lVar22 & 0x7fffffff);
        do {
          iVar10 = piVar11[uVar30 - 1];
          pPVar6 = chains[iVar10].pixels;
          iVar9 = chains[iVar10].len;
          uVar39 = (ulong)iVar9;
          if (1 < (int)uVar40) {
            PVar2 = pPVar6[uVar39 - 1];
            pvVar26 = (this->segmentPoints).
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar7 = pvVar26 + this->segmentNos;
            puVar16 = (undefined8 *)
                      ((ulong)(uVar40 - 2) * 8 +
                      *(long *)&(pvVar7->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data);
            do {
              iVar17 = PVar2.x - (int)*puVar16;
              iVar51 = PVar2.y - (int)((ulong)*puVar16 >> 0x20);
              iVar37 = iVar17 >> 0x1f;
              iVar27 = iVar51 >> 0x1f;
              uVar24 = CONCAT44(iVar51,iVar17) ^ CONCAT44(iVar27,iVar37);
              uVar50 = (int)uVar24 - iVar37;
              uVar52 = (int)(uVar24 >> 0x20) - iVar27;
              auVar47._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
              auVar47._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
              auVar47._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
              auVar47._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
              iVar37 = movmskpd((int)pvVar26,auVar47);
              if (iVar37 != 0) goto LAB_001081a0;
              ppPVar1 = (pointer *)
                        ((long)&(pvVar7->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data + 8);
              *ppPVar1 = *ppPVar1 + -1;
              pvVar26 = (pointer)(ulong)(uVar40 - 1);
              iVar37 = uVar40 - 2;
              puVar16 = puVar16 + -1;
              uVar40 = uVar40 - 1;
            } while (0 < iVar37);
            uVar40 = 1;
          }
LAB_001081a0:
          if ((iVar9 < 2) || ((int)uVar40 < 1)) {
            if (0 < iVar9) goto LAB_00108208;
          }
          else {
            uVar3 = *(undefined8 *)
                     (*(long *)&(this->segmentPoints).
                                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data + -8 + (ulong)uVar40 * 8);
            iVar37 = pPVar6[uVar39 - 2].x - (int)uVar3;
            iVar27 = pPVar6[uVar39 - 2].y - (int)((ulong)uVar3 >> 0x20);
            iVar17 = iVar37 >> 0x1f;
            iVar51 = iVar27 >> 0x1f;
            uVar24 = CONCAT44(iVar27,iVar37) ^ CONCAT44(iVar51,iVar17);
            uVar50 = (int)uVar24 - iVar17;
            uVar52 = (int)(uVar24 >> 0x20) - iVar51;
            auVar43._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
            auVar43._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
            auVar43._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
            auVar43._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
            iVar37 = movmskpd((int)pPVar6,auVar43);
            if (iVar37 == 0) {
              uVar39 = (ulong)(iVar9 - 1U);
              chains[iVar10].len = iVar9 - 1U;
            }
LAB_00108208:
            uVar24 = (uVar39 & 0xffffffff) + 1;
            lVar22 = (uVar39 & 0xffffffff) * 8;
            do {
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                        ((this->segmentPoints).
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                         (value_type *)((long)&chains[iVar10].pixels[-1].x + lVar22));
              uVar24 = uVar24 - 1;
              lVar22 = lVar22 + -8;
            } while (1 < uVar24);
            local_e0 = (int)uVar39;
            uVar40 = uVar40 + local_e0;
          }
          chains[iVar10].len = 0;
          bVar42 = 1 < (long)uVar30;
          uVar30 = uVar30 - 1;
        } while (bVar42);
      }
    }
    iVar10 = LongestChain(chains,chains->children[0]);
    if (1 < iVar10) {
      iVar10 = chains->children[0];
      if (iVar10 == -1) {
        uVar30 = 0;
      }
      else {
        uVar30 = 0;
        do {
          piVar11[uVar30] = iVar10;
          iVar9 = chains[iVar10].children[0];
          if (chains[iVar10].children[0] == -1) {
            iVar9 = chains[iVar10].children[1];
          }
          iVar10 = iVar9;
          uVar30 = uVar30 + 1;
        } while (iVar10 != -1);
      }
      iVar10 = *piVar11;
      chains[iVar10].pixels = chains[iVar10].pixels + 1;
      chains[iVar10].len = chains[iVar10].len + -1;
      if (0 < (int)uVar30) {
        uVar39 = 0;
        do {
          iVar10 = piVar11[uVar39];
          pPVar6 = chains[iVar10].pixels;
          if (1 < (int)uVar40) {
            PVar2 = *pPVar6;
            pvVar26 = (this->segmentPoints).
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar7 = pvVar26 + this->segmentNos;
            puVar16 = (undefined8 *)
                      ((ulong)(uVar40 - 2) * 8 +
                      *(long *)&(pvVar7->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data);
            do {
              iVar27 = PVar2.x - (int)*puVar16;
              iVar17 = PVar2.y - (int)((ulong)*puVar16 >> 0x20);
              iVar9 = iVar27 >> 0x1f;
              iVar37 = iVar17 >> 0x1f;
              uVar24 = CONCAT44(iVar17,iVar27) ^ CONCAT44(iVar37,iVar9);
              uVar50 = (int)uVar24 - iVar9;
              uVar52 = (int)(uVar24 >> 0x20) - iVar37;
              auVar48._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
              auVar48._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
              auVar48._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
              auVar48._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
              iVar9 = movmskpd((int)pvVar26,auVar48);
              if (iVar9 != 0) goto LAB_001083a3;
              ppPVar1 = (pointer *)
                        ((long)&(pvVar7->
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                )._M_impl.super__Vector_impl_data + 8);
              *ppPVar1 = *ppPVar1 + -1;
              pvVar26 = (pointer)(ulong)(uVar40 - 1);
              iVar9 = uVar40 - 2;
              puVar16 = puVar16 + -1;
              uVar40 = uVar40 - 1;
            } while (0 < iVar9);
            uVar40 = 1;
          }
LAB_001083a3:
          uVar50 = 0;
          if ((1 < chains[iVar10].len) && (0 < (int)uVar40)) {
            uVar3 = *(undefined8 *)
                     (*(long *)&(this->segmentPoints).
                                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data + -8 + (ulong)uVar40 * 8);
            iVar9 = pPVar6[1].x - (int)uVar3;
            iVar37 = pPVar6[1].y - (int)((ulong)uVar3 >> 0x20);
            iVar27 = iVar9 >> 0x1f;
            iVar17 = iVar37 >> 0x1f;
            uVar24 = CONCAT44(iVar37,iVar9) ^ CONCAT44(iVar17,iVar27);
            uVar50 = (int)uVar24 - iVar27;
            uVar52 = (int)(uVar24 >> 0x20) - iVar17;
            auVar44._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
            auVar44._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
            auVar44._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
            auVar44._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
            iVar9 = movmskpd((int)pPVar6,auVar44);
            uVar50 = (uint)(iVar9 == 0);
          }
          if ((int)uVar50 < chains[iVar10].len) {
            uVar24 = (ulong)(uVar50 * 8);
            do {
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                        ((this->segmentPoints).
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                         (value_type *)((long)&(chains[iVar10].pixels)->x + uVar24));
              uVar40 = uVar40 + 1;
              uVar24 = uVar24 + 8;
              uVar50 = uVar50 + 1;
            } while ((int)uVar50 < chains[iVar10].len);
          }
          chains[iVar10].len = 0;
          uVar39 = uVar39 + 1;
        } while (uVar39 != (uVar30 & 0xffffffff));
      }
    }
    iVar10 = this->segmentNos;
    pvVar7 = (this->segmentPoints).
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar22 = *(long *)&pvVar7[iVar10].
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                       _M_impl.super__Vector_impl_data;
    uVar3 = *(undefined8 *)(lVar22 + -8 + (long)(int)uVar40 * 8);
    iVar9 = (int)*(undefined8 *)(lVar22 + 8) - (int)uVar3;
    iVar37 = (int)((ulong)*(undefined8 *)(lVar22 + 8) >> 0x20) - (int)((ulong)uVar3 >> 0x20);
    iVar27 = iVar9 >> 0x1f;
    iVar17 = iVar37 >> 0x1f;
    uVar30 = CONCAT44(iVar37,iVar9) ^ CONCAT44(iVar17,iVar27);
    uVar50 = (int)uVar30 - iVar27;
    uVar52 = (int)(uVar30 >> 0x20) - iVar17;
    auVar45._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
    auVar45._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
    auVar45._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
    auVar45._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
    iVar9 = movmskpd(uVar40,auVar45);
    if (iVar9 == 0) {
      pPVar8 = *(pointer *)
                ((long)&pvVar7[iVar10].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data + 8);
      if (((pointer)(lVar22 + 8) != pPVar8) &&
         (lVar32 = (long)pPVar8 - (lVar22 + 8) >> 3, 0 < lVar32)) {
        uVar30 = lVar32 + 1;
        lVar22 = lVar22 + 0xc;
        do {
          *(undefined8 *)(lVar22 + -0xc) = *(undefined8 *)(lVar22 + -4);
          uVar30 = uVar30 - 1;
          lVar22 = lVar22 + 8;
        } while (1 < uVar30);
      }
      *(pointer *)
       ((long)&pvVar7[iVar10].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
               ._M_impl.super__Vector_impl_data + 8) = pPVar8 + -1;
    }
    this->segmentNos = iVar10 + 1;
    local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    std::
    vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
    ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
              (local_40,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_68);
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_);
    }
    if (2 < lVar41) {
      uVar30 = 2;
      do {
        if ((1 < chains[uVar30].len) && (iVar10 = LongestChain(chains,(int)uVar30), 9 < iVar10)) {
          uVar39 = 0;
          uVar24 = uVar30 & 0xffffffff;
          do {
            iVar10 = (int)uVar24;
            piVar11[uVar39] = iVar10;
            uVar40 = chains[iVar10].children[0];
            if (uVar40 == 0xffffffff) {
              uVar40 = chains[iVar10].children[1];
            }
            uVar24 = (ulong)uVar40;
            uVar39 = uVar39 + 1;
          } while (uVar40 != 0xffffffff);
          if (0 < (int)uVar39) {
            uVar24 = 0;
            uVar40 = 0;
            do {
              iVar10 = piVar11[uVar24];
              pPVar6 = chains[iVar10].pixels;
              if (1 < (int)uVar40) {
                PVar2 = *pPVar6;
                pvVar26 = (this->segmentPoints).
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar7 = pvVar26 + this->segmentNos;
                puVar16 = (undefined8 *)
                          ((ulong)(uVar40 - 2) * 8 +
                          *(long *)&(pvVar7->
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    )._M_impl.super__Vector_impl_data);
                do {
                  iVar27 = PVar2.x - (int)*puVar16;
                  iVar17 = PVar2.y - (int)((ulong)*puVar16 >> 0x20);
                  iVar9 = iVar27 >> 0x1f;
                  iVar37 = iVar17 >> 0x1f;
                  uVar25 = CONCAT44(iVar17,iVar27) ^ CONCAT44(iVar37,iVar9);
                  uVar50 = (int)uVar25 - iVar9;
                  uVar52 = (int)(uVar25 >> 0x20) - iVar37;
                  auVar49._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
                  auVar49._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
                  auVar49._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
                  auVar49._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
                  iVar9 = movmskpd((int)pvVar26,auVar49);
                  if (iVar9 != 0) goto LAB_00108687;
                  ppPVar1 = (pointer *)
                            ((long)&(pvVar7->
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    )._M_impl.super__Vector_impl_data + 8);
                  *ppPVar1 = *ppPVar1 + -1;
                  pvVar26 = (pointer)(ulong)(uVar40 - 1);
                  iVar9 = uVar40 - 2;
                  puVar16 = puVar16 + -1;
                  uVar40 = uVar40 - 1;
                } while (0 < iVar9);
                uVar40 = 1;
              }
LAB_00108687:
              uVar50 = 0;
              if ((1 < chains[iVar10].len) && (0 < (int)uVar40)) {
                uVar3 = *(undefined8 *)
                         (*(long *)&(this->segmentPoints).
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[this->segmentNos].
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    ._M_impl.super__Vector_impl_data + -8 + (ulong)uVar40 * 8);
                iVar9 = pPVar6[1].x - (int)uVar3;
                iVar37 = pPVar6[1].y - (int)((ulong)uVar3 >> 0x20);
                iVar27 = iVar9 >> 0x1f;
                iVar17 = iVar37 >> 0x1f;
                uVar25 = CONCAT44(iVar37,iVar9) ^ CONCAT44(iVar17,iVar27);
                uVar50 = (int)uVar25 - iVar27;
                uVar52 = (int)(uVar25 >> 0x20) - iVar17;
                auVar46._0_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
                auVar46._4_4_ = -(uint)(-0x7fffffff < (int)(uVar50 ^ 0x80000000));
                auVar46._8_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
                auVar46._12_4_ = -(uint)(-0x7fffffff < (int)(uVar52 ^ 0x80000000));
                iVar9 = movmskpd((int)pPVar6,auVar46);
                uVar50 = (uint)(iVar9 == 0);
              }
              if ((int)uVar50 < chains[iVar10].len) {
                uVar25 = (ulong)(uVar50 * 8);
                do {
                  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                            ((this->segmentPoints).
                             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->segmentNos,
                             (value_type *)((long)&(chains[iVar10].pixels)->x + uVar25));
                  uVar40 = uVar40 + 1;
                  uVar25 = uVar25 + 8;
                  uVar50 = uVar50 + 1;
                } while ((int)uVar50 < chains[iVar10].len);
              }
              chains[iVar10].len = 0;
              uVar24 = uVar24 + 1;
            } while (uVar24 != (uVar39 & 0xffffffff));
          }
          local_68 = (undefined1  [16])0x0;
          local_58 = (pointer)0x0;
          std::
          vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
          ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                    (local_40,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_68
                    );
          if ((pointer)local_68._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_68._0_8_);
          }
          this->segmentNos = this->segmentNos + 1;
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar29);
    }
  }
LAB_001087a0:
  lVar41 = local_38 + -1;
  if (local_38 < 2) goto LAB_001087b9;
  goto LAB_0010770c;
}

Assistant:

void ED::JoinAnchorPointsUsingSortedAnchors()
{
	int *chainNos = new int[(width + height) * 8];

	Point *pixels = new Point[width*height];
	StackNode *stack = new StackNode[width*height];
	Chain *chains = new Chain[width*height];

	// sort the anchor points by their gradient value in decreasing order
	int *A = sortAnchorsByGradValue1();

	// Now join the anchors starting with the anchor having the greatest gradient value
	int totalPixels = 0;

	for (int k = anchorNos - 1; k >= 0; k--) {
		int pixelOffset = A[k];

		int i = pixelOffset / width;
		int j = pixelOffset % width;

		//int i = anchorPoints[k].y;
		//int j = anchorPoints[k].x;

		if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

		chains[0].len = 0;
		chains[0].parent = -1;
		chains[0].dir = 0;
		chains[0].children[0] = chains[0].children[1] = -1;
		chains[0].pixels = NULL;


		int noChains = 1;
		int len = 0;
		int duplicatePixelCount = 0;
		int top = -1;  // top of the stack 

		if (dirImg[i*width + j] == EDGE_VERTICAL) {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_DOWN;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_UP;
			stack[top].parent = 0;

		}
		else {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_RIGHT;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_LEFT;
			stack[top].parent = 0;
		} //end-else

		  // While the stack is not empty
	StartOfWhile:
		while (top >= 0) {
			int r = stack[top].r;
			int c = stack[top].c;
			int dir = stack[top].dir;
			int parent = stack[top].parent;
			top--;

			if (edgeImg[r*width + c] != EDGE_PIXEL) duplicatePixelCount++;

			chains[noChains].dir = dir;   // traversal direction
			chains[noChains].parent = parent;
			chains[noChains].children[0] = chains[noChains].children[1] = -1;


			int chainLen = 0;

			chains[noChains].pixels = &pixels[len];

			pixels[len].y = r;
			pixels[len].x = c;
			len++;
			chainLen++;

			if (dir == ED_LEFT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look LEFT
					//
					//   A
					//   B x 
					//   C 
					//
					// cleanup up & down pixels
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c - 1] >= ANCHOR_PIXEL) { c--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow max. pixel to the LEFT
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[r*width + c - 1];
						int C = gradImg[(r + 1)*width + c - 1];

						if (A > B) {
							if (A > C) r--;
							else       r++;
						}
						else  if (C > B) r++;
						c--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else if (dir == ED_RIGHT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look RIGHT
					//
					//     A
					//   x B
					//     C
					//
					// cleanup up&down pixels
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c + 1] >= ANCHOR_PIXEL) { c++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow max. pixel to the RIGHT
						int A = gradImg[(r - 1)*width + c + 1];
						int B = gradImg[r*width + c + 1];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) r--;       // A
							else       r++;       // C
						}
						else if (C > B) r++;  // C
						c++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;  // Go down
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;   // Go up
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;

			}
			else if (dir == ED_UP) {
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical. Look UP
					//
					//   A B C
					//     x
					//
					// Cleanup left & right pixels
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r - 1)*width + c] >= ANCHOR_PIXEL) { r--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow the max. pixel UP
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[(r - 1)*width + c];
						int C = gradImg[(r - 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;
							else       c++;
						}
						else if (C > B) c++;
						r--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else { // dir == DOWN
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical
					//
					//     x
					//   A B C
					//
					// cleanup side pixels
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r + 1)*width + c] >= ANCHOR_PIXEL) { r++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow the max. pixel DOWN
						int A = gradImg[(r + 1)*width + c - 1];
						int B = gradImg[(r + 1)*width + c];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;       // A
							else       c++;       // C
						}
						else if (C > B) c++;  // C
						r++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else

					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;
			} //end-else

		} //end-while


		if (len - duplicatePixelCount < minPathLen) {
			for (int k = 0; k<len; k++) {

				edgeImg[pixels[k].y*width + pixels[k].x] = 0;
				edgeImg[pixels[k].y*width + pixels[k].x] = 0;

			} //end-for

		}
		else {

			int noSegmentPixels = 0;

			int totalLen = LongestChain(chains, chains[0].children[1]);

			if (totalLen > 0) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[1], chainNos);

				// Copy these pixels in the reverse order
				for (int k = count - 1; k >= 0; k--) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */

					int fr = chains[chainNo].pixels[chains[chainNo].len - 1].y;
					int fc = chains[chainNo].pixels[chains[chainNo].len - 1].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					if (chains[chainNo].len > 1 && noSegmentPixels > 0) {
						fr = chains[chainNo].pixels[chains[chainNo].len - 2].y;
						fc = chains[chainNo].pixels[chains[chainNo].len - 2].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) chains[chainNo].len--;
					} //end-if
#endif

					for (int l = chains[chainNo].len - 1; l >= 0; l--) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if

			totalLen = LongestChain(chains, chains[0].children[0]);
			if (totalLen > 1) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[0], chainNos);

				// Copy these chains in the forward direction. Skip the first pixel of the first chain
				// due to repetition with the last pixel of the previous chain
				int lastChainNo = chainNos[0];
				chains[lastChainNo].pixels++;
				chains[lastChainNo].len--;

				for (int k = 0; k<count; k++) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */
					int fr = chains[chainNo].pixels[0].y;
					int fc = chains[chainNo].pixels[0].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					int startIndex = 0;
					int chainLen = chains[chainNo].len;
					if (chainLen > 1 && noSegmentPixels > 0) {
						int fr = chains[chainNo].pixels[1].y;
						int fc = chains[chainNo].pixels[1].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) { startIndex = 1; }
					} //end-if
#endif

					  /* Start a new chain & copy pixels from the new chain */
					for (int l = startIndex; l<chains[chainNo].len; l++) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if


			  // See if the first pixel can be cleaned up
			int fr = segmentPoints[segmentNos][1].y;
			int fc = segmentPoints[segmentNos][1].x;


			int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
			int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);


			if (dr <= 1 && dc <= 1) {
				segmentPoints[segmentNos].erase(segmentPoints[segmentNos].begin());
				noSegmentPixels--;
			} //end-if

			segmentNos++;
			segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

													  // Copy the rest of the long chains here
			for (int k = 2; k<noChains; k++) {
				if (chains[k].len < 2) continue;

				totalLen = LongestChain(chains, k);

				if (totalLen >= 10) {

					// Retrieve the chainNos
					int count = RetrieveChainNos(chains, k, chainNos);

					// Copy the pixels
					noSegmentPixels = 0;
					for (int k = 0; k<count; k++) {
						int chainNo = chainNos[k];

#if 1					
						/* See if we can erase some pixels from the last chain. This is for cleanup */
						int fr = chains[chainNo].pixels[0].y;
						int fc = chains[chainNo].pixels[0].x;

						int index = noSegmentPixels - 2;
						while (index >= 0) {
							int dr = abs(fr - segmentPoints[segmentNos][index].y);
							int dc = abs(fc - segmentPoints[segmentNos][index].x);

							if (dr <= 1 && dc <= 1) {
								// neighbors. Erase last pixel
								segmentPoints[segmentNos].pop_back();
								noSegmentPixels--;
								index--;
							}
							else break;
						} //end-while

						int startIndex = 0;
						int chainLen = chains[chainNo].len;
						if (chainLen > 1 && noSegmentPixels > 0) {
							int fr = chains[chainNo].pixels[1].y;
							int fc = chains[chainNo].pixels[1].x;

							int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
							int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

							if (dr <= 1 && dc <= 1) { startIndex = 1; }
						} //end-if
#endif
						  /* Start a new chain & copy pixels from the new chain */
						for (int l = startIndex; l<chains[chainNo].len; l++) {
							segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
							noSegmentPixels++;
						} //end-for

						chains[chainNo].len = 0;  // Mark as copied
					} //end-for
					segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments
					segmentNos++;
				} //end-if          
			} //end-for

		} //end-else

	} //end-for-outer

	// pop back last segment from vector
	// because of one preallocation in the beginning, it will always empty
	segmentPoints.pop_back();

	// Clean up
	delete[] A;
	delete[] chains;
	delete[] stack;
	delete[] chainNos;
	delete[] pixels;
}